

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdNegatePrivkey(void *handle,char *privkey,char **output)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  KeyApi api;
  Privkey key;
  KeyApi local_91;
  undefined1 local_90 [32];
  string local_70;
  Privkey local_50;
  
  cfd::Initialize();
  if (output == (char **)0x0) {
    local_90._0_8_ = "cfdcapi_key.cpp";
    local_90._8_4_ = 0x65e;
    local_90._16_8_ = "CfdNegatePrivkey";
    cfd::core::logger::log<>((CfdSourceLocation *)local_90,kCfdLogLevelWarning,"output is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_90._0_8_ = local_90 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"Failed to parameter. output is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_90);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(privkey);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_70,privkey,(allocator *)&local_50);
    cfd::api::KeyApi::GetPrivkey((Privkey *)local_90,&local_91,&local_70,(NetType *)0x0,(bool *)0x0)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    cfd::core::Privkey::CreateNegate(&local_50,(Privkey *)local_90);
    cfd::core::Privkey::GetHex_abi_cxx11_(&local_70,&local_50);
    pcVar2 = cfd::capi::CreateString(&local_70);
    *output = pcVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_50.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((pointer)local_90._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_90._0_8_);
    }
    return 0;
  }
  local_90._0_8_ = "cfdcapi_key.cpp";
  local_90._8_4_ = 0x664;
  local_90._16_8_ = "CfdNegatePrivkey";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_90,kCfdLogLevelWarning,"privkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_90._0_8_ = local_90 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"Failed to parameter. privkey is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_90);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdNegatePrivkey(void* handle, const char* privkey, char** output) {
  try {
    cfd::Initialize();
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }

    KeyApi api;
    Privkey key = api.GetPrivkey(std::string(privkey), nullptr, nullptr);
    *output = CreateString(key.CreateNegate().GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}